

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall SQLite::Statement::bindNoCopy(Statement *this,int aIndex,void *apValue,int aSize)

{
  int aRet;
  sqlite3_stmt *pStmt;
  int ret;
  int aSize_local;
  void *apValue_local;
  int aIndex_local;
  Statement *this_local;
  
  pStmt = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  aRet = sqlite3_bind_blob(pStmt,aIndex,apValue,aSize,(_func_void_void_ptr *)0x0);
  check(this,aRet);
  return;
}

Assistant:

void Statement::bindNoCopy(const int aIndex, const void* apValue, const int aSize)
{
    const int ret = sqlite3_bind_blob(mStmtPtr, aIndex, apValue, aSize, SQLITE_STATIC);
    check(ret);
}